

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpt.cpp
# Opt level: O2

Score __thiscall
indigox::algorithm::FPTOptimisation::ScoreVertex(FPTOptimisation *this,MolVertPair v,VertMask *f)

{
  Score SVar1;
  size_type sVar2;
  mapped_type *ppvVar3;
  ElnVertex u;
  ElnDist actualDist;
  VertMask placed;
  mapped_type local_70;
  key_type local_68;
  ElnDist local_58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  SVar1 = Options::AssignElectrons::INF;
  local_68.second = v.second;
  local_68.first = v.first;
  boost::operator&(&local_38,f,&this->placedMask_);
  sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(&local_38);
  if (sVar2 <= ((this->super_ElectronOptimisationAlgorithm).parent_)->electronsToAdd_) {
    VertMaskToElnDist(&local_58,this,&local_38);
    ppvVar3 = std::
              map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
              ::at(&(this->super_ElectronOptimisationAlgorithm).mvp2ev_,&local_68);
    local_70 = *ppvVar3;
    ElectronOptimisationAlgorithm::SetElectronDistribution
              (&this->super_ElectronOptimisationAlgorithm,&local_58);
    ElectronOptimisationAlgorithm::DetermineFormalCharges
              (&this->super_ElectronOptimisationAlgorithm);
    SVar1 = ElectronOptimisationAlgorithm::CalculateVertexEnergy
                      (&this->super_ElectronOptimisationAlgorithm,&local_70);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38);
  return SVar1;
}

Assistant:

Score FPTOptimisation::ScoreVertex(MolVertPair v, VertMask f)
{  
  Score s = opt_::INF;
  const VertMask placed = f & placedMask_;
  if (placed.count() > parent_->electronsToAdd_) return s;
  
  ElnDist actualDist = VertMaskToElnDist(placed);
  
  ElnVertex u = mvp2ev_.at(v);
  SetElectronDistribution(actualDist);
  DetermineFormalCharges();
  s = CalculateVertexEnergy(u);
  return s;
}